

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

int asn1_string_set_uint64(ASN1_STRING *out,uint64_t v,int type)

{
  int iVar1;
  ulong local_38;
  size_t leading_zeros;
  uint8_t buf [8];
  int type_local;
  uint64_t v_local;
  ASN1_STRING *out_local;
  
  buf._0_4_ = type;
  unique0x100000a1 = v;
  CRYPTO_store_u64_be((void *)((long)&leading_zeros + 4),v);
  for (local_38 = 0; (local_38 < 8 && (*(char *)((long)&leading_zeros + local_38 + 4) == '\0'));
      local_38 = local_38 + 1) {
  }
  iVar1 = ASN1_STRING_set(out,(void *)((long)&leading_zeros + local_38 + 4),8 - local_38);
  if (iVar1 != 0) {
    out->type = buf._0_4_;
  }
  out_local._4_4_ = (uint)(iVar1 != 0);
  return out_local._4_4_;
}

Assistant:

static int asn1_string_set_uint64(ASN1_STRING *out, uint64_t v, int type) {
  uint8_t buf[sizeof(uint64_t)];
  CRYPTO_store_u64_be(buf, v);
  size_t leading_zeros;
  for (leading_zeros = 0; leading_zeros < sizeof(buf); leading_zeros++) {
    if (buf[leading_zeros] != 0) {
      break;
    }
  }

  if (!ASN1_STRING_set(out, buf + leading_zeros, sizeof(buf) - leading_zeros)) {
    return 0;
  }
  out->type = type;
  return 1;
}